

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O1

void nn_fsm_start(nn_fsm *self)

{
  int iVar1;
  
  if (self->state == 1) {
    iVar1 = nn_queue_item_isinqueue(&(self->stopped).item);
    if (iVar1 == 0) {
      (*self->fn)(self,-2,-2,(void *)0x0);
      self->state = 2;
      return;
    }
  }
  nn_fsm_start_cold_1();
}

Assistant:

void nn_fsm_start (struct nn_fsm *self)
{
    nn_assert (nn_fsm_isidle (self));
    self->fn (self, NN_FSM_ACTION, NN_FSM_START, NULL);
    self->state = NN_FSM_STATE_ACTIVE;
}